

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O3

void TPZShapeHCurl<pzshape::TPZShapeCube>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *curlphi)

{
  int iVar1;
  pair<int,_long> *ppVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int d;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  TPZShapeH1<pzshape::TPZShapeCube>::Shape(pt,data);
  if (0 < (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements) {
    lVar14 = 0;
    lVar7 = 0;
    do {
      ppVar2 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
      iVar1 = ppVar2[lVar7].first;
      lVar11 = (long)iVar1;
      lVar15 = (long)(int)ppVar2[lVar7].second;
      lVar9 = 0;
      do {
        if (((lVar15 < 0) ||
            ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
             <= lVar15)) ||
           ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <
            1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar10 = (data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                 super_TPZBaseMatrix.fRow;
        if (((lVar10 <= lVar9) || (iVar1 < 0)) ||
           ((data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
            super_TPZBaseMatrix.fCol <= lVar11)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar3 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar3 <= lVar9) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7))
        {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)((long)phi->fElem + lVar9 * 8 + lVar3 * lVar14) =
             (data->fPhi).super_TPZFMatrix<double>.fElem[lVar15] *
             (data->fMasterDirections).super_TPZFMatrix<double>.fElem[lVar10 * lVar11 + lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar9 = (curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      lVar10 = 0;
      do {
        lVar3 = lVar10 + 1;
        uVar6 = (ulong)((int)lVar10 - 1);
        lVar8 = 0;
        if (lVar10 != 2) {
          lVar8 = lVar3;
        }
        lVar12 = (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                 fRow * lVar15;
        pdVar4 = (data->fDPhi).super_TPZFMatrix<double>.fElem;
        if (lVar10 == 0) {
          uVar6 = 2;
        }
        lVar13 = (data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                 super_TPZBaseMatrix.fRow * lVar11;
        pdVar5 = (data->fMasterDirections).super_TPZFMatrix<double>.fElem;
        if ((lVar9 <= lVar10) ||
           ((curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)((long)curlphi->fElem + lVar10 * 8 + lVar14 * lVar9) =
             pdVar4[lVar12 + lVar8] * pdVar5[lVar13 + uVar6] -
             pdVar5[lVar13 + lVar8] * pdVar4[lVar12 + uVar6];
        lVar10 = lVar3;
      } while (lVar3 != 3);
      lVar7 = lVar7 + 1;
      lVar14 = lVar14 + 8;
    } while (lVar7 < (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements);
  }
  return;
}

Assistant:

void TPZShapeHCurl<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &curlphi)
{

    constexpr int ncorner = TSHAPE::NCornerNodes;
    constexpr int nsides = TSHAPE::NSides;
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    
    TPZShapeH1<TSHAPE>::Shape(pt,data);
    for(int i = 0; i< data.fSDVecShapeIndex.size(); i++)
    {
        const auto &it = data.fSDVecShapeIndex[i];
        const int vecindex = it.first;
        const int scalindex = it.second;
        
        for(int d = 0; d<TSHAPE::Dimension; d++)
        {
            phi(d,i) = data.fPhi(scalindex,0)*data.fMasterDirections(d,vecindex);
        }

        if constexpr (dim==1){
            curlphi(0,i) =
                data.fDPhi.GetVal( 0,vecindex) *
                data.fMasterDirections.GetVal(0,vecindex);
        }else if constexpr (dim==2){
            curlphi(0,i) =
                data.fDPhi.GetVal(0,scalindex) *
                data.fMasterDirections.GetVal(1,vecindex) -
                data.fDPhi.GetVal(1,scalindex) *
                data.fMasterDirections.GetVal(0,vecindex);
            }
        else if constexpr(dim==3){
            for(auto d = 0; d < dim; d++) {
                const auto di = (d+1)%dim;
                const auto dj = (d+2)%dim;
                curlphi(d,i) =
                    data.fDPhi.GetVal(di,scalindex) *
                    data.fMasterDirections.GetVal(dj,vecindex)-
                    data.fDPhi.GetVal(dj,scalindex) *
                    data.fMasterDirections.GetVal(di,vecindex);
            }
        }else{
            if constexpr (std::is_same_v<TSHAPE,TSHAPE>){
                static_assert(!sizeof(TSHAPE),"Invalid curl dimension");
            }
        }        
    }
}